

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndType
          (UCharsTrieBuilder *this,UBool hasValue,int32_t value,int32_t node)

{
  short sVar1;
  ssize_t sVar2;
  uint local_30;
  ushort local_2a;
  int32_t length;
  int32_t iStack_24;
  UChar intUnits [3];
  int32_t node_local;
  int32_t value_local;
  UBool hasValue_local;
  UCharsTrieBuilder *this_local;
  
  iStack_24 = node;
  intUnits._2_4_ = value;
  if (hasValue == '\0') {
    this_local._4_4_ =
         (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])(this,(ulong)(uint)node)
    ;
  }
  else {
    sVar1 = (short)value;
    if ((value < 0) || (0xfdffff < value)) {
      local_2a = 0x7fc0;
      local_30 = 3;
      length._0_2_ = (short)((uint)value >> 0x10);
      length._2_2_ = sVar1;
    }
    else if (value < 0x100) {
      local_2a = (sVar1 + 1) * 0x40;
      local_30 = 1;
    }
    else {
      local_2a = ((ushort)(value >> 10) & 0x7fc0) + 0x4040;
      local_30 = 2;
      length._0_2_ = sVar1;
    }
    local_2a = local_2a | (ushort)node;
    sVar2 = write(this,(int)&local_2a,(void *)(ulong)local_30,(ulong)(node & 0xffff));
    this_local._4_4_ = (int)sVar2;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndType(UBool hasValue, int32_t value, int32_t node) {
    if(!hasValue) {
        return write(node);
    }
    UChar intUnits[3];
    int32_t length;
    if(value<0 || value>UCharsTrie::kMaxTwoUnitNodeValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitNodeValueLead);
        intUnits[1]=(UChar)((uint32_t)value>>16);
        intUnits[2]=(UChar)value;
        length=3;
    } else if(value<=UCharsTrie::kMaxOneUnitNodeValue) {
        intUnits[0]=(UChar)((value+1)<<6);
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitNodeValueLead+((value>>10)&0x7fc0));
        intUnits[1]=(UChar)value;
        length=2;
    }
    intUnits[0]|=(UChar)node;
    return write(intUnits, length);
}